

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O3

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitCallRef(InternalAnalyzer *this,CallRef *curr)

{
  EffectAnalyzer *pEVar1;
  char cVar2;
  
  cVar2 = ::wasm::Type::isRef();
  if (cVar2 != '\0') {
    ::wasm::Type::getHeapType();
    cVar2 = ::wasm::HeapType::isBottom();
    if (cVar2 != '\0') {
      this->parent->trap = true;
      return;
    }
  }
  pEVar1 = this->parent;
  pEVar1->calls = true;
  if ((((pEVar1->features).features & 0x40) != 0) && (pEVar1->tryDepth == 0)) {
    pEVar1->throws_ = true;
  }
  if (curr[0x38] == (CallRef)0x1) {
    pEVar1->branchesOut = true;
  }
  cVar2 = ::wasm::Type::isNullable();
  if (cVar2 != '\0') {
    this->parent->implicitTrap = true;
  }
  return;
}

Assistant:

void visitCallRef(CallRef* curr) {
      if (curr->target->type.isNull()) {
        parent.trap = true;
        return;
      }
      parent.calls = true;
      if (parent.features.hasExceptionHandling() && parent.tryDepth == 0) {
        parent.throws_ = true;
      }
      if (curr->isReturn) {
        parent.branchesOut = true;
      }
      // traps when the call target is null
      if (curr->target->type.isNullable()) {
        parent.implicitTrap = true;
      }
    }